

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessSamplersTests.cpp
# Opt level: O3

void __thiscall gl4cts::DirectStateAccess::Samplers::FunctionalTest::clean(FunctionalTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  if (this->m_vao != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao);
    this->m_vao = 0;
  }
  if (this->m_to != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to);
    this->m_to = 0;
  }
  if (this->m_so != 0) {
    (**(code **)(lVar2 + 0x468))(1,&this->m_so);
    this->m_so = 0;
  }
  if (this->m_po != 0) {
    (**(code **)(lVar2 + 0x1680))(0);
    (**(code **)(lVar2 + 0x448))(this->m_po);
    this->m_po = 0;
  }
  return;
}

Assistant:

void FunctionalTest::clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release framebuffer. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	/* Release renderbuffer. */
	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}

	/* Release vertex array object. */
	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	/* Release texture. */
	if (m_to)
	{
		gl.deleteTextures(1, &m_to);

		m_to = 0;
	}

	/* Release sampler. */
	if (m_so)
	{
		gl.deleteSamplers(1, &m_so);

		m_so = 0;
	}

	/* Release GLSL program. */
	if (m_po)
	{
		gl.useProgram(0);

		gl.deleteProgram(m_po);

		m_po = 0;
	}
}